

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

compute_mul_parity_result
fmt::v9::detail::dragonbox::cache_accessor<float>::compute_mul_parity
          (carrier_uint two_f,cache_entry_type *cache,int beta)

{
  uint64_t uVar1;
  int in_EDX;
  uint64_t *in_RSI;
  uint32_t in_EDI;
  uint64_t r;
  int in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  undefined2 local_2;
  
  if (in_EDX < 1) {
    assert_fail(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,(char *)0x1cb522);
  }
  if (in_EDX < 0x40) {
    uVar1 = umul96_lower64(in_EDI,*in_RSI);
    local_2._1_1_ = (int)(uVar1 >> (0x20U - (char)in_EDX & 0x3f)) == 0;
    local_2._0_1_ = (uVar1 >> (0x40U - (char)in_EDX & 0x3f) & 1) != 0;
    return local_2;
  }
  assert_fail(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,(char *)0x1cb543);
}

Assistant:

static compute_mul_parity_result compute_mul_parity(
      carrier_uint two_f, const cache_entry_type& cache, int beta) noexcept {
    FMT_ASSERT(beta >= 1, "");
    FMT_ASSERT(beta < 64, "");

    auto r = umul96_lower64(two_f, cache);
    return {((r >> (64 - beta)) & 1) != 0,
            static_cast<uint32_t>(r >> (32 - beta)) == 0};
  }